

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3FkClearTriggerCache(sqlite3 *db,int iDb)

{
  HashElem *pHVar1;
  long lVar2;
  
  for (pHVar1 = ((db->aDb[iDb].pSchema)->tblHash).first; pHVar1 != (HashElem *)0x0;
      pHVar1 = pHVar1->next) {
    if (*(char *)((long)pHVar1->data + 0x3f) == '\0') {
      for (lVar2 = *(long *)((long)pHVar1->data + 0x48); lVar2 != 0; lVar2 = *(long *)(lVar2 + 8)) {
        fkTriggerDelete(db,*(Trigger **)(lVar2 + 0x30));
        *(undefined8 *)(lVar2 + 0x30) = 0;
        fkTriggerDelete(db,*(Trigger **)(lVar2 + 0x38));
        *(undefined8 *)(lVar2 + 0x38) = 0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkClearTriggerCache(sqlite3 *db, int iDb){
  HashElem *k;
  Hash *pHash = &db->aDb[iDb].pSchema->tblHash;
  for(k=sqliteHashFirst(pHash); k; k=sqliteHashNext(k)){
    Table *pTab = sqliteHashData(k);
    FKey *pFKey;
    if( !IsOrdinaryTable(pTab) ) continue;
    for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
      fkTriggerDelete(db, pFKey->apTrigger[0]); pFKey->apTrigger[0] = 0;
      fkTriggerDelete(db, pFKey->apTrigger[1]); pFKey->apTrigger[1] = 0;
    }
  }
}